

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O2

void __thiscall TUPU::TImage::setPath(TImage *this,string *filepath)

{
  std::__cxx11::string::_M_assign((string *)&this->m_path);
  (this->m_url)._M_string_length = 0;
  *(this->m_url)._M_dataplus._M_p = '\0';
  free(this->m_buffer);
  this->m_len = 0;
  (this->m_filename)._M_string_length = 0;
  *(this->m_filename)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void TImage::setPath(const string & filepath)
{
    m_path = filepath;
    m_url.clear();
    std::free(m_buffer);
    m_len = 0;
    m_filename.clear();
}